

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_item_t_conflict add_item(MIR_context_t ctx,MIR_item_t_conflict item)

{
  bool bVar1;
  MIR_context_t pMVar2;
  char *pcVar3;
  MIR_context_t pMVar4;
  MIR_error_func_t p_Var5;
  MIR_item_t_conflict tab_item;
  MIR_context_t pMStack_20;
  int replace_p;
  MIR_item_t_conflict item_local;
  MIR_context_t ctx_local;
  
  pMStack_20 = (MIR_context_t)item;
  item_local = (MIR_item_t_conflict)ctx;
  pcVar3 = MIR_item_name(ctx,item);
  pMVar4 = (MIR_context_t)item_tab_find(ctx,pcVar3,(MIR_module_t_conflict)pMStack_20->c2mir_ctx);
  if (pMVar4 == (MIR_context_t)0x0) {
    DLIST_MIR_item_t_append
              ((DLIST_MIR_item_t *)&(item_local[1].u.func)->original_vars_num,
               (MIR_item_t_conflict)pMStack_20);
    HTAB_MIR_item_t_do((HTAB_MIR_item_t *)item_local[1].data,(MIR_item_t_conflict)pMStack_20,
                       HTAB_INSERT,(MIR_item_t_conflict *)&stack0xffffffffffffffe0);
    ctx_local = pMStack_20;
  }
  else {
    pMVar2 = pMVar4;
    switch(*(MIR_item_type_t *)&pMVar4->insn_nops) {
    case MIR_proto_item:
      p_Var5 = MIR_get_error_func((MIR_context_t)item_local);
      (*p_Var5)(MIR_repeated_decl_error,"item %s was already defined as proto",
                ((anon_union_8_10_166bea1d_for_u *)&pMVar4->used_label_p)->func->name);
    case MIR_func_item:
    case MIR_data_item:
    case MIR_ref_data_item:
    case MIR_lref_data_item:
    case MIR_expr_data_item:
    case MIR_bss_item:
      if (*(MIR_item_type_t *)&pMStack_20->insn_nops == MIR_export_item) {
        if (*(char *)&pMVar4->temp_data == '\0') {
          *(char *)&pMVar4->temp_data = '\x01';
          DLIST_MIR_item_t_append
                    ((DLIST_MIR_item_t *)&(item_local[1].u.func)->original_vars_num,
                     (MIR_item_t_conflict)pMStack_20);
          pMStack_20->unspec_protos = (VARR_MIR_proto_t *)pMVar4;
          pMVar2 = pMStack_20;
        }
      }
      else if (*(MIR_item_type_t *)&pMStack_20->insn_nops == MIR_forward_item) {
        DLIST_MIR_item_t_append
                  ((DLIST_MIR_item_t *)&(item_local[1].u.func)->original_vars_num,
                   (MIR_item_t_conflict)pMStack_20);
        pMStack_20->unspec_protos = (VARR_MIR_proto_t *)pMVar4;
        pMVar2 = pMStack_20;
      }
      else {
        if (*(MIR_item_type_t *)&pMStack_20->insn_nops == MIR_import_item) {
          p_Var5 = MIR_get_error_func((MIR_context_t)item_local);
          (*p_Var5)(MIR_import_export_error,"import of local definition %s",
                    ((anon_union_8_10_166bea1d_for_u *)&pMStack_20->used_label_p)->func);
        }
        p_Var5 = MIR_get_error_func((MIR_context_t)item_local);
        pcVar3 = MIR_item_name((MIR_context_t)item_local,(MIR_item_t_conflict)pMStack_20);
        (*p_Var5)(MIR_repeated_decl_error,"Repeated item declaration %s",pcVar3);
        pMVar2 = pMStack_20;
      }
      break;
    case MIR_import_item:
      if (*(MIR_item_type_t *)&pMStack_20->insn_nops != MIR_import_item) {
        p_Var5 = MIR_get_error_func((MIR_context_t)item_local);
        (*p_Var5)(MIR_import_export_error,"existing module definition %s already defined as import",
                  ((anon_union_8_10_166bea1d_for_u *)&pMVar4->used_label_p)->func);
      }
      break;
    case MIR_export_item:
    case MIR_forward_item:
      bVar1 = false;
      if (*(MIR_item_type_t *)&pMStack_20->insn_nops == MIR_import_item) {
        p_Var5 = MIR_get_error_func((MIR_context_t)item_local);
        (*p_Var5)(MIR_import_export_error,"export/forward of import %s",
                  ((anon_union_8_10_166bea1d_for_u *)&pMStack_20->used_label_p)->func);
      }
      if ((*(MIR_item_type_t *)&pMStack_20->insn_nops == MIR_export_item) ||
         (*(MIR_item_type_t *)&pMStack_20->insn_nops == MIR_forward_item)) {
        if (*(MIR_item_type_t *)&pMVar4->insn_nops != *(MIR_item_type_t *)&pMStack_20->insn_nops) {
          DLIST_MIR_item_t_append
                    ((DLIST_MIR_item_t *)&(item_local[1].u.func)->original_vars_num,
                     (MIR_item_t_conflict)pMStack_20);
          pMVar2 = pMStack_20;
        }
        pMStack_20 = pMVar2;
        if ((*(MIR_item_type_t *)&pMStack_20->insn_nops == MIR_export_item) &&
           (*(MIR_item_type_t *)&pMVar4->insn_nops == MIR_forward_item)) {
          bVar1 = true;
        }
      }
      else {
        bVar1 = true;
        DLIST_MIR_item_t_append
                  ((DLIST_MIR_item_t *)&(item_local[1].u.func)->original_vars_num,
                   (MIR_item_t_conflict)pMStack_20);
      }
      pMVar2 = pMStack_20;
      if (bVar1) {
        pMVar4->unspec_protos = (VARR_MIR_proto_t *)pMStack_20;
        if (*(MIR_item_type_t *)&pMVar4->insn_nops == MIR_export_item) {
          *(char *)&pMStack_20->temp_data = '\x01';
        }
        item_tab_remove((MIR_context_t)item_local,(MIR_item_t_conflict)pMVar4);
        pMVar4 = (MIR_context_t)
                 item_tab_insert((MIR_context_t)item_local,(MIR_item_t_conflict)pMStack_20);
        pMVar2 = pMStack_20;
        if (pMStack_20 != pMVar4) {
          __assert_fail("item == tab_item",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x3f4,"MIR_item_t add_item(MIR_context_t, MIR_item_t)");
        }
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x414,"MIR_item_t add_item(MIR_context_t, MIR_item_t)");
    }
    pMStack_20 = pMVar2;
    ctx_local = pMStack_20;
  }
  return (MIR_item_t_conflict)ctx_local;
}

Assistant:

static MIR_item_t add_item (MIR_context_t ctx, MIR_item_t item) {
  int replace_p;
  MIR_item_t tab_item;

  if ((tab_item = item_tab_find (ctx, MIR_item_name (ctx, item), item->module)) == NULL) {
    DLIST_APPEND (MIR_item_t, curr_module->items, item);
    HTAB_DO (MIR_item_t, module_item_tab, item, HTAB_INSERT, item);
    return item;
  }
  switch (tab_item->item_type) {
  case MIR_import_item:
    if (item->item_type != MIR_import_item)
      MIR_get_error_func (ctx) (MIR_import_export_error,
                                "existing module definition %s already defined as import",
                                tab_item->u.import_id);
    item = tab_item;
    break;
  case MIR_export_item:
  case MIR_forward_item:
    replace_p = FALSE;
    if (item->item_type == MIR_import_item) {
      MIR_get_error_func (ctx) (MIR_import_export_error, "export/forward of import %s",
                                item->u.import_id);
    } else if (item->item_type != MIR_export_item && item->item_type != MIR_forward_item) {
      replace_p = TRUE;
      DLIST_APPEND (MIR_item_t, curr_module->items, item);
    } else {
      if (tab_item->item_type == item->item_type)
        item = tab_item;
      else
        DLIST_APPEND (MIR_item_t, curr_module->items, item);
      if (item->item_type == MIR_export_item && tab_item->item_type == MIR_forward_item)
        replace_p = TRUE;
    }
    if (replace_p) { /* replace forward by export or export/forward by its definition: */
      tab_item->ref_def = item;
      if (tab_item->item_type == MIR_export_item) item->export_p = TRUE;
      item_tab_remove (ctx, tab_item);
      tab_item = item_tab_insert (ctx, item);
      mir_assert (item == tab_item);
    }
    break;
  case MIR_proto_item:
    MIR_get_error_func (ctx) (MIR_repeated_decl_error, "item %s was already defined as proto",
                              tab_item->u.proto->name);
    break;
  case MIR_bss_item:
  case MIR_data_item:
  case MIR_ref_data_item:
  case MIR_lref_data_item:
  case MIR_expr_data_item:
  case MIR_func_item:
    if (item->item_type == MIR_export_item) {
      if (tab_item->export_p) {
        item = tab_item;
      } else { /* just keep one export: */
        tab_item->export_p = TRUE;
        DLIST_APPEND (MIR_item_t, curr_module->items, item);
        item->ref_def = tab_item;
      }
    } else if (item->item_type == MIR_forward_item) {
      DLIST_APPEND (MIR_item_t, curr_module->items, item);
      item->ref_def = tab_item;
    } else if (item->item_type == MIR_import_item) {
      MIR_get_error_func (ctx) (MIR_import_export_error, "import of local definition %s",
                                item->u.import_id);
    } else {
      MIR_get_error_func (ctx) (MIR_repeated_decl_error, "Repeated item declaration %s",
                                MIR_item_name (ctx, item));
    }
    break;
  default: mir_assert (FALSE);
  }
  return item;
}